

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_cutter.h
# Opt level: O1

bool __thiscall
flow_cutter::MultiCutter::
advance<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>>,flow_cutter::expanded_graph::Capacity,flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>>>,flow_cutter::BreadthFirstSearch,flow_cutter::PierceNodeScore>
          (MultiCutter *this,
          Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>
          *graph,TemporaryData *tmp,BreadthFirstSearch *search_algo,
          PierceNodeScore *score_pierce_node,bool should_skip_non_maximum_sides)

{
  undefined8 *puVar1;
  int iVar2;
  void *pvVar3;
  undefined8 uVar4;
  uint uVar5;
  AssimilatedNodeSet *pAVar6;
  byte bVar7;
  bool bVar8;
  iterator __end3;
  long lVar9;
  pointer pDVar10;
  int iVar11;
  long lVar12;
  pointer pDVar13;
  vector<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
  *__range3;
  uint uVar14;
  int iVar15;
  pointer pDVar16;
  ulong uVar17;
  uint uVar18;
  undefined7 in_register_00000089;
  int iVar19;
  anon_class_16_2_0ed2c766 my_score_pierce_node;
  type x;
  byte local_153d;
  int local_153c;
  ulong local_1538;
  undefined4 local_152c;
  anon_class_16_2_5167d1e9 local_1528;
  TemporaryData *local_1518;
  BreadthFirstSearch *local_1510;
  anon_class_16_2_0ed2c766 local_1508;
  PierceNodeScore *local_14f8;
  DistanceAwareCutter local_14f0;
  
  local_152c = (undefined4)CONCAT71(in_register_00000089,should_skip_non_maximum_sides);
  if ((graph->tail).original_node_count == this->current_smaller_side_size) {
    local_153d = 0;
  }
  else {
    iVar15 = this->current_cutter_id;
    pDVar13 = (this->cutter_list).
              super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar11 = *(int *)pDVar13[iVar15].cutter.assimilated;
    if ((pDVar13[iVar15].cutter.reachable[0].node_set.node_count_inside_ == iVar11) &&
       (iVar2 = (((AssimilatedNodeSet *)((long)pDVar13[iVar15].cutter.assimilated + 0x40))->node_set
                ).node_count_inside_,
       iVar11 <= iVar2 ||
       (((ReachableNodeSet *)((long)pDVar13[iVar15].cutter.reachable + 0x38))->node_set).
       node_count_inside_ != iVar2)) {
      iVar11 = 0;
    }
    else {
      iVar11 = 1;
    }
    local_1538 = (ulong)(*(long *)((long)pDVar13[iVar15].cutter.assimilated +
                                  (ulong)(uint)(iVar11 << 6) + 0x30) -
                        *(long *)((long)pDVar13[iVar15].cutter.assimilated +
                                 (ulong)(uint)(iVar11 << 6) + 0x28)) >> 2;
    local_1518 = tmp;
    local_1510 = search_algo;
    local_14f8 = score_pierce_node;
    do {
      local_153c = 0;
      pDVar13 = (this->cutter_list).
                super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pDVar10 = (this->cutter_list).
                super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar14 = (int)((ulong)((long)pDVar10 - (long)pDVar13) >> 6) * 0x2b2e43db;
      if (0 < (int)uVar14) {
        do {
          lVar9 = (long)local_153c;
          lVar12 = 0;
          do {
            *(undefined4 *)
             ((long)&local_14f0.cutter.assimilated[0].node_set.node_count_inside_ + lVar12) =
                 *(undefined4 *)
                  ((long)&pDVar13[lVar9].cutter.assimilated[0].node_set.node_count_inside_ + lVar12)
            ;
            *(undefined4 *)
             ((long)&local_14f0.cutter.assimilated[0].node_set.inside_flag.preimage_ + lVar12) =
                 *(undefined4 *)
                  ((long)&pDVar13[lVar9].cutter.assimilated[0].node_set.inside_flag.preimage_ +
                  lVar12);
            *(undefined4 *)
             ((long)&local_14f0.cutter.assimilated[0].node_set.inside_flag.data_ + lVar12) =
                 *(undefined4 *)
                  ((long)&pDVar13[lVar9].cutter.assimilated[0].node_set.inside_flag.data_.
                          preimage_count_ + lVar12);
            *(undefined8 *)
             ((long)&local_14f0.cutter.assimilated[0].node_set.inside_flag.data_ + lVar12 + 8U) =
                 *(undefined8 *)
                  ((long)&pDVar13[lVar9].cutter.assimilated[0].node_set.inside_flag.data_.data_ +
                  lVar12);
            *(undefined4 *)
             ((long)&pDVar13[lVar9].cutter.assimilated[0].node_set.inside_flag.data_.preimage_count_
             + lVar12) = 0;
            *(undefined8 *)
             ((long)&pDVar13[lVar9].cutter.assimilated[0].node_set.inside_flag.data_.data_ + lVar12)
                 = 0;
            *(undefined4 *)((long)&local_14f0.cutter.assimilated[0].node_set.extra_node + lVar12) =
                 *(undefined4 *)
                  ((long)&pDVar13[lVar9].cutter.assimilated[0].node_set.extra_node + lVar12);
            puVar1 = (undefined8 *)
                     ((long)&pDVar13[lVar9].cutter.assimilated[0].front.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar12);
            uVar4 = puVar1[1];
            *(undefined8 *)
             ((long)&local_14f0.cutter.assimilated[0].front.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl + lVar12) = *puVar1;
            *(undefined8 *)
             ((long)&local_14f0.cutter.assimilated[0].front.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl + lVar12 + 8) = uVar4;
            *(undefined8 *)
             ((long)&local_14f0.cutter.assimilated[0].front.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl + lVar12 + 0x10) =
                 *(undefined8 *)
                  ((long)&pDVar13[lVar9].cutter.assimilated[0].front.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + lVar12);
            *(undefined8 *)
             ((long)&pDVar13[lVar9].cutter.assimilated[0].front.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_end_of_storage + lVar12) = 0;
            puVar1 = (undefined8 *)
                     ((long)&pDVar13[lVar9].cutter.assimilated[0].front.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar12);
            *puVar1 = 0;
            puVar1[1] = 0;
            lVar12 = lVar12 + 0x40;
          } while (lVar12 != 0x80);
          lVar12 = 0xb0;
          do {
            *(undefined4 *)((long)&local_1528.this + lVar12) =
                 *(undefined4 *)((long)pDVar13[lVar9].cutter.assimilated + lVar12 + -0x30);
            *(undefined4 *)((long)&local_1518 + lVar12) =
                 *(undefined4 *)((long)pDVar13[lVar9].cutter.assimilated + lVar12 + -0x28);
            *(undefined4 *)((long)&local_1510 + lVar12) =
                 *(undefined4 *)((long)pDVar13[lVar9].cutter.assimilated + lVar12 + -0x20);
            *(undefined8 *)((long)&local_1508.score_pierce_node + lVar12) =
                 *(undefined8 *)((long)pDVar13[lVar9].cutter.assimilated + lVar12 + -0x18);
            *(undefined4 *)((long)pDVar13[lVar9].cutter.assimilated + lVar12 + -0x20) = 0;
            *(undefined8 *)((long)pDVar13[lVar9].cutter.assimilated + lVar12 + -0x18) = 0;
            *(undefined4 *)((long)&local_1508.i + lVar12) =
                 *(undefined4 *)((long)pDVar13[lVar9].cutter.assimilated + lVar12 + -0x10);
            *(undefined4 *)((long)local_14f0.cutter.assimilated + lVar12 + -8) =
                 *(undefined4 *)((long)pDVar13[lVar9].cutter.assimilated + lVar12 + -8);
            *(undefined8 *)
             ((long)&local_14f0.cutter.assimilated[0].node_set.node_count_inside_ + lVar12) =
                 *(undefined8 *)
                  ((long)&pDVar13[lVar9].cutter.assimilated[0].node_set.node_count_inside_ + lVar12)
            ;
            *(undefined4 *)((long)pDVar13[lVar9].cutter.assimilated + lVar12 + -8) = 0;
            *(undefined8 *)
             ((long)&pDVar13[lVar9].cutter.assimilated[0].node_set.node_count_inside_ + lVar12) = 0;
            lVar12 = lVar12 + 0x38;
          } while (lVar12 != 0x120);
          local_14f0.cutter.flow.flow.preimage_ = pDVar13[lVar9].cutter.flow.flow.preimage_;
          local_14f0.cutter.flow.flow.data_.preimage_count_ =
               pDVar13[lVar9].cutter.flow.flow.data_.preimage_count_;
          local_14f0.cutter.flow.flow.data_.data_ = pDVar13[lVar9].cutter.flow.flow.data_.data_;
          pDVar13[lVar9].cutter.flow.flow.data_.preimage_count_ = 0;
          pDVar13[lVar9].cutter.flow.flow.data_.data_ = (unsigned_long *)0x0;
          local_14f0.cutter.flow_intensity = pDVar13[lVar9].cutter.flow_intensity;
          pDVar10 = pDVar13 + lVar9;
          local_14f0.cutter.cut_available = (pDVar10->cutter).cut_available;
          local_14f0.cutter._265_3_ = *(undefined3 *)&(pDVar10->cutter).field_0x109;
          local_14f0.cutter.max_flow_intensity = (pDVar10->cutter).max_flow_intensity;
          lVar12 = 0x120;
          do {
            *(undefined4 *)((long)local_14f0.cutter.assimilated + lVar12 + -8) =
                 *(undefined4 *)((long)pDVar13[lVar9].cutter.assimilated + lVar12 + -8);
            *(undefined8 *)
             ((long)&local_14f0.cutter.assimilated[0].node_set.node_count_inside_ + lVar12) =
                 *(undefined8 *)
                  ((long)&pDVar13[lVar9].cutter.assimilated[0].node_set.node_count_inside_ + lVar12)
            ;
            *(undefined4 *)((long)pDVar13[lVar9].cutter.assimilated + lVar12 + -8) = 0;
            *(undefined8 *)
             ((long)&pDVar13[lVar9].cutter.assimilated[0].node_set.node_count_inside_ + lVar12) = 0;
            lVar12 = lVar12 + 0x10;
          } while (lVar12 != 0x140);
          memcpy(&local_14f0.rng,&pDVar13[lVar9].rng,5000);
          local_1508.score_pierce_node = local_14f8;
          local_1508.i = &local_153c;
          if (local_14f0.cutter.cut_available == true) {
            if ((local_14f0.cutter.reachable[0].node_set.node_count_inside_ !=
                 local_14f0.cutter.assimilated[0].node_set.node_count_inside_) ||
               (pAVar6 = local_14f0.cutter.assimilated,
               local_14f0.cutter.assimilated[1].node_set.node_count_inside_ <
               local_14f0.cutter.assimilated[0].node_set.node_count_inside_ &&
               local_14f0.cutter.reachable[1].node_set.node_count_inside_ ==
               local_14f0.cutter.assimilated[1].node_set.node_count_inside_)) {
              pAVar6 = local_14f0.cutter.assimilated + 1;
            }
            if (((int)local_1538 ==
                 (int)((ulong)((long)(pAVar6->front).super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(pAVar6->front).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2)) &&
               (local_1528.score_pierce_node = &local_1508, local_1528.this = &local_14f0,
               bVar8 = BasicCutter::
                       advance<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>,_flow_cutter::BreadthFirstSearch,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_ben_strasser[P]flow_cutter_pace20_src_flow_cutter_h:810:37)>
                                 (&local_14f0.cutter,graph,local_1518,local_1510,
                                  (anon_class_16_2_5167d1e9 *)&local_1528), bVar8)) {
              do {
                local_1528.score_pierce_node = &local_1508;
                local_1528.this = &local_14f0;
                bVar8 = BasicCutter::
                        does_next_advance_increase_cut<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_ben_strasser[P]flow_cutter_pace20_src_flow_cutter_h:825:37)>
                                  (&local_14f0.cutter,graph,&local_1528);
                if (bVar8) break;
                local_1528.score_pierce_node = &local_1508;
                local_1528.this = &local_14f0;
                bVar8 = BasicCutter::
                        advance<flow_cutter::Graph<flow_cutter::expanded_graph::Tail<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Head<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::BackArc<ConstRefIDIDFunc<ArrayIDIDFunc>_>,_flow_cutter::expanded_graph::Capacity,_flow_cutter::expanded_graph::OutArc<ConstRefIDFunc<RangeIDIDMultiFunc>_>_>,_flow_cutter::BreadthFirstSearch,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_ben_strasser[P]flow_cutter_pace20_src_flow_cutter_h:810:37)>
                                  (&local_14f0.cutter,graph,local_1518,local_1510,
                                   (anon_class_16_2_5167d1e9 *)&local_1528);
              } while (((byte)local_152c & bVar8) != 0);
            }
          }
          DistanceAwareCutter::operator=
                    ((this->cutter_list).
                     super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
                     ._M_impl.super__Vector_impl_data._M_start + local_153c,&local_14f0);
          lVar9 = 0x130;
          do {
            pvVar3 = *(void **)((long)&local_14f0.cutter.assimilated[0].node_set.node_count_inside_
                               + lVar9);
            if (pvVar3 != (void *)0x0) {
              operator_delete__(pvVar3);
            }
            lVar9 = lVar9 + -0x10;
          } while (lVar9 != 0x110);
          if (local_14f0.cutter.flow.flow.data_.data_ != (unsigned_long *)0x0) {
            operator_delete__(local_14f0.cutter.flow.flow.data_.data_);
          }
          lVar9 = 0xd0;
          do {
            pvVar3 = *(void **)((long)&local_14f0.cutter.assimilated[0].node_set.inside_flag.data_ +
                               lVar9 + 8U);
            if (pvVar3 != (void *)0x0) {
              operator_delete__(pvVar3);
            }
            pvVar3 = *(void **)((long)&local_14f0.cutter.assimilated[0].node_set.node_count_inside_
                               + lVar9);
            if (pvVar3 != (void *)0x0) {
              operator_delete__(pvVar3);
            }
            lVar9 = lVar9 + -0x38;
          } while (lVar9 != 0x60);
          lVar9 = 0x58;
          do {
            pvVar3 = *(void **)((long)&local_14f0.cutter.assimilated[0].node_set.inside_flag.data_ +
                               lVar9);
            if (pvVar3 != (void *)0x0) {
              operator_delete(pvVar3);
            }
            pvVar3 = *(void **)((long)&local_14f0.cutter.assimilated[0].node_set.node_count_inside_
                               + lVar9);
            if (pvVar3 != (void *)0x0) {
              operator_delete__(pvVar3);
            }
            lVar9 = lVar9 + -0x40;
          } while (lVar9 != -0x28);
          local_153c = local_153c + 1;
          pDVar13 = (this->cutter_list).
                    super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pDVar10 = (this->cutter_list).
                    super__Vector_base<flow_cutter::DistanceAwareCutter,_std::allocator<flow_cutter::DistanceAwareCutter>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          iVar15 = (int)((ulong)((long)pDVar10 - (long)pDVar13) >> 6);
          uVar14 = iVar15 * 0x2b2e43db;
        } while (SBORROW4(local_153c,uVar14) != local_153c + iVar15 * -0x2b2e43db < 0);
      }
      uVar5 = 0x7fffffff;
      for (pDVar16 = pDVar13; pDVar16 != pDVar10; pDVar16 = pDVar16 + 1) {
        uVar18 = uVar5;
        if ((pDVar16->cutter).cut_available == true) {
          iVar15 = (pDVar16->cutter).assimilated[0].node_set.node_count_inside_;
          if (((pDVar16->cutter).reachable[0].node_set.node_count_inside_ == iVar15) &&
             (iVar11 = (pDVar16->cutter).assimilated[1].node_set.node_count_inside_,
             iVar15 <= iVar11 ||
             (pDVar16->cutter).reachable[1].node_set.node_count_inside_ != iVar11)) {
            iVar15 = 0;
          }
          else {
            iVar15 = 1;
          }
          uVar18 = (uint)((ulong)(*(long *)((long)&(pDVar16->cutter).assimilated[0].front.
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_finish +
                                           (ulong)(uint)(iVar15 << 6)) -
                                 *(long *)((long)&(pDVar16->cutter).assimilated[0].front.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start +
                                          (ulong)(uint)(iVar15 << 6))) >> 2);
          if ((int)uVar5 < (int)uVar18) {
            uVar18 = uVar5;
          }
        }
        uVar5 = uVar18;
      }
      iVar15 = 0;
      bVar8 = false;
      bVar7 = 0;
      if (uVar5 != 0x7fffffff) {
        if ((int)uVar14 < 1) {
          local_1538._0_4_ = -1;
        }
        else {
          uVar17 = 0;
          local_1538 = 0xffffffff;
          iVar15 = 0;
          pDVar10 = pDVar13;
          do {
            if ((pDVar10->cutter).cut_available == true) {
              iVar11 = (pDVar10->cutter).assimilated[0].node_set.node_count_inside_;
              iVar2 = (pDVar10->cutter).reachable[0].node_set.node_count_inside_;
              if ((iVar2 == iVar11) &&
                 (iVar19 = (pDVar10->cutter).assimilated[1].node_set.node_count_inside_,
                 iVar11 <= iVar19 ||
                 (pDVar10->cutter).reachable[1].node_set.node_count_inside_ != iVar19)) {
                iVar19 = 0;
              }
              else {
                iVar19 = 1;
              }
              if (uVar5 == (uint)((ulong)(*(long *)((long)&(pDVar10->cutter).assimilated[0].front.
                                                                                                                      
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish +
                                                  (ulong)(uint)(iVar19 << 6)) -
                                         *(long *)((long)&(pDVar10->cutter).assimilated[0].front.
                                                                                                                    
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start +
                                                  (ulong)(uint)(iVar19 << 6))) >> 2)) {
                if ((iVar2 == iVar11) &&
                   (iVar19 = (pDVar10->cutter).assimilated[1].node_set.node_count_inside_,
                   iVar11 <= iVar19 ||
                   (pDVar10->cutter).reachable[1].node_set.node_count_inside_ != iVar19)) {
                  iVar19 = 0;
                }
                else {
                  iVar19 = 1;
                }
                if (iVar15 < *(int *)((long)&(pDVar10->cutter).assimilated[0].node_set.
                                             node_count_inside_ + (ulong)(uint)(iVar19 << 6))) {
                  if ((iVar2 == iVar11) &&
                     (iVar15 = (pDVar10->cutter).assimilated[1].node_set.node_count_inside_,
                     iVar11 <= iVar15 ||
                     (pDVar10->cutter).reachable[1].node_set.node_count_inside_ != iVar15)) {
                    iVar15 = 0;
                  }
                  else {
                    iVar15 = 1;
                  }
                  iVar15 = *(int *)((long)&(pDVar10->cutter).assimilated[0].node_set.
                                           node_count_inside_ + (ulong)(uint)(iVar15 << 6));
                  local_1538 = uVar17 & 0xffffffff;
                }
              }
            }
            uVar17 = uVar17 + 1;
            pDVar10 = pDVar10 + 1;
          } while (uVar14 != uVar17);
        }
        bVar8 = iVar15 <= this->current_smaller_side_size;
        if (this->current_smaller_side_size < iVar15) {
          this->current_cutter_id = (int)local_1538;
          lVar9 = (long)(int)local_1538;
          iVar15 = pDVar13[lVar9].cutter.assimilated[0].node_set.node_count_inside_;
          if ((pDVar13[lVar9].cutter.reachable[0].node_set.node_count_inside_ == iVar15) &&
             (iVar11 = pDVar13[lVar9].cutter.assimilated[1].node_set.node_count_inside_,
             iVar15 <= iVar11 ||
             pDVar13[lVar9].cutter.reachable[1].node_set.node_count_inside_ != iVar11)) {
            iVar15 = 0;
          }
          else {
            iVar15 = 1;
          }
          this->current_smaller_side_size =
               *(int *)((long)&pDVar13[lVar9].cutter.assimilated[0].node_set.node_count_inside_ +
                       (ulong)(uint)(iVar15 << 6));
          bVar8 = false;
          local_1538 = (ulong)uVar5;
          bVar7 = 1;
        }
        else {
          local_1538 = (ulong)uVar5;
          bVar7 = local_153d;
        }
      }
      local_153d = bVar7;
    } while (bVar8);
  }
  return (bool)(local_153d & 1);
}

Assistant:

bool advance(const Graph& graph, TemporaryData& tmp,
        const SearchAlgorithm& search_algo,
        const ScorePierceNode& score_pierce_node,
        bool should_skip_non_maximum_sides = true)
    {
        if (graph.node_count() / 2 == get_current_smaller_cut_side_size())
            return false;

        int current_cut_size = cutter_list[current_cutter_id].get_current_cut().size();
        for (;;) {
            for (int i = 0; i < (int)cutter_list.size(); ++i) {
                auto x = std::move(cutter_list[i]);
                auto my_score_pierce_node = [&](int x, int side,
                                                bool causes_augmenting_path,
                                                int source_dist, int target_dist) {
                    return score_pierce_node(x, side, causes_augmenting_path, source_dist,
                        target_dist, i);
                };
                if (x.is_cut_available()) {
                    if ((int)x.get_current_cut().size() == current_cut_size) {
                        assert(
                            x.does_next_advance_increase_cut(graph, my_score_pierce_node));
                        if (x.advance(graph, tmp, search_algo, my_score_pierce_node)) {
                            assert((int)x.get_current_cut().size() > current_cut_size);
                            while (!x.does_next_advance_increase_cut(graph,
                                my_score_pierce_node)) {
                                if (!x.advance(graph, tmp, search_algo, my_score_pierce_node))
                                    break;
                                if (!should_skip_non_maximum_sides)
                                    break;
                            }
                        }
                    }
                }

                cutter_list[i] = std::move(x);
            }

            int next_cut_size = std::numeric_limits<int>::max();
            for (auto& x : cutter_list)
                if (x.is_cut_available())
                    min_to(next_cut_size, (int)x.get_current_cut().size());

            if (next_cut_size == std::numeric_limits<int>::max())
                return false;

            int best_cutter_weight = 0;
            int best_cutter_id = -1;
            for (int i = 0; i < (int)cutter_list.size(); ++i) {
                if (cutter_list[i].is_cut_available()) {
                    if ((int)cutter_list[i].get_current_cut().size() == next_cut_size && cutter_list[i].get_current_smaller_cut_side_size() > best_cutter_weight) {
                        best_cutter_id = i;
                        best_cutter_weight = cutter_list[i].get_current_smaller_cut_side_size();
                    }
                }
            }

            assert(best_cutter_id != -1);

            current_cut_size = next_cut_size;

            if (best_cutter_weight <= current_smaller_side_size)
                continue;

            current_cutter_id = best_cutter_id;
            current_smaller_side_size = cutter_list[current_cutter_id].get_current_smaller_cut_side_size();
            return true;
        }
    }